

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall FxAbs::FxAbs(FxAbs *this,FxExpression *v)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,&v->ScriptPosition);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_Abs;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxAbs_007102b0;
  this->val = v;
  (this->super_FxExpression).ValueType = v->ValueType;
  return;
}

Assistant:

FxAbs::FxAbs(FxExpression *v)
: FxExpression(EFX_Abs, v->ScriptPosition)
{
	val = v;
	ValueType = v->ValueType;
}